

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSetAttrItem::RhsPrettyPrint
          (GdlSetAttrItem *this,GrcManager *pcman,GdlRule *prule,int irit,ostream *strmOut,bool fXml
          )

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  ostream *in_R8;
  byte in_R9B;
  GrcSymbolTableEntry *in_stack_00000028;
  string local_50 [39];
  byte local_29;
  ostream *local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_00000028);
  std::operator<<(in_R8,local_50);
  std::__cxx11::string::~string(local_50);
  (**(code **)(*in_RDI + 0x138))(in_RDI,local_10,local_18,local_1c,local_28,local_29 & 1);
  std::operator<<(local_28,"  ");
  return;
}

Assistant:

void GdlSetAttrItem::RhsPrettyPrint(GrcManager * pcman, GdlRule * prule, int irit,
	std::ostream & strmOut, bool fXml)
{
	strmOut << m_psymInput->FullAbbrev();
	AttrSetterPrettyPrint(pcman, prule, irit, strmOut, fXml);
	strmOut << "  ";
}